

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O1

void __thiscall
cmFortranParser_s::cmFortranParser_s
          (cmFortranParser_s *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defines,cmFortranSourceInfo *info)

{
  yyscan_t *ptr_yy_globals;
  YY_BUFFER_STATE_conflict1 new_buffer;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->IncludePath,includes);
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>::_M_initialize_map
            ((_Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_> *)&this->FileStack,0);
  (this->TokenString)._M_dataplus._M_p = (pointer)&(this->TokenString).field_2;
  (this->TokenString)._M_string_length = 0;
  (this->TokenString).field_2._M_local_buf[0] = '\0';
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->PPDefinitions)._M_t,&defines->_M_t);
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  std::_Deque_base<bool,_std::allocator<bool>_>::_M_initialize_map
            ((_Deque_base<bool,_std::allocator<bool>_> *)&this->SkipToEnd,0);
  this->Info = info;
  this->InInterface = false;
  this->InPPFalseBranch = 0;
  ptr_yy_globals = &this->Scanner;
  cmFortran_yylex_init(ptr_yy_globals);
  cmFortran_yyset_extra(this,this->Scanner);
  new_buffer = cmFortran_yy_create_buffer((FILE *)0x0,4,*ptr_yy_globals);
  cmFortran_yy_switch_to_buffer(new_buffer,*ptr_yy_globals);
  return;
}

Assistant:

cmFortranParser_s
::cmFortranParser_s(std::vector<std::string> const& includes,
                    std::set<std::string> const& defines,
                    cmFortranSourceInfo& info):
  IncludePath(includes), PPDefinitions(defines), Info(info)
{
  this->InInterface = 0;
  this->InPPFalseBranch = 0;

  // Initialize the lexical scanner.
  cmFortran_yylex_init(&this->Scanner);
  cmFortran_yyset_extra(this, this->Scanner);

  // Create a dummy buffer that is never read but is the fallback
  // buffer when the last file is popped off the stack.
  YY_BUFFER_STATE buffer =
    cmFortran_yy_create_buffer(0, 4, this->Scanner);
  cmFortran_yy_switch_to_buffer(buffer, this->Scanner);
}